

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_namespace::preprocess
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  element_type *peVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  any local_38;
  string name;
  
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  local_38.mDat = (proxy *)(*pptVar2)[1]._vptr_token_base;
  pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  std::__cxx11::string::string((string *)&name,(string *)(*pptVar3 + 3));
  peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cs_impl::any::any<std::__cxx11::string>(&local_38,&name);
  domain_manager::add_var_no_return<char_const(&)[35]>
            (&(peVar1->super_runtime_type).storage,
             (char (*) [35])"__PRAGMA_CS_NAMESPACE_DEFINITION__",&local_38);
  cs_impl::any::recycle(&local_38);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void method_namespace::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::string name = static_cast<token_id *>(static_cast<token_expr *>(raw.front().at(
		                       1))->get_tree().root().data())->get_id();
		context->instance->storage.add_var_no_return("__PRAGMA_CS_NAMESPACE_DEFINITION__", name);
	}